

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

int __thiscall Cleaner::CleanRules(Cleaner *this,int rule_count,char **rules)

{
  char *__s;
  State *pSVar1;
  bool bVar2;
  Rule *rule;
  ulong uVar3;
  allocator<char> local_59;
  char **local_58;
  string local_50;
  
  local_58 = rules;
  if (rules != (char **)0x0) {
    Reset(this);
    PrintHeader(this);
    LoadDyndeps(this);
    if (rule_count < 1) {
      rule_count = 0;
    }
    for (uVar3 = 0; (uint)rule_count != uVar3; uVar3 = uVar3 + 1) {
      __s = local_58[uVar3];
      pSVar1 = this->state_;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_59);
      rule = BindingEnv::LookupRule(&pSVar1->bindings_,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (rule == (Rule *)0x0) {
        Error("unknown rule \'%s\'",__s);
        this->status_ = 1;
      }
      else {
        bVar2 = IsVerbose(this);
        if (bVar2) {
          printf("Rule %s\n",__s);
        }
        DoCleanRule(this,rule);
      }
    }
    PrintFooter(this);
    return this->status_;
  }
  __assert_fail("rules",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean.cc"
                ,0xfe,"int Cleaner::CleanRules(int, char **)");
}

Assistant:

int Cleaner::CleanRules(int rule_count, char* rules[]) {
  assert(rules);

  Reset();
  PrintHeader();
  LoadDyndeps();
  for (int i = 0; i < rule_count; ++i) {
    const char* rule_name = rules[i];
    const Rule* rule = state_->bindings_.LookupRule(rule_name);
    if (rule) {
      if (IsVerbose())
        printf("Rule %s\n", rule_name);
      DoCleanRule(rule);
    } else {
      Error("unknown rule '%s'", rule_name);
      status_ = 1;
    }
  }
  PrintFooter();
  return status_;
}